

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printc.cc
# Opt level: O1

void __thiscall PrintC::emitStatement(PrintC *this,PcodeOp *inst)

{
  EmitXml *pEVar1;
  uint uVar2;
  
  uVar2 = (*((this->super_PrintLanguage).emit)->_vptr_EmitXml[0xe])();
  (*(this->super_PrintLanguage)._vptr_PrintLanguage[0xd])(this,inst);
  pEVar1 = (this->super_PrintLanguage).emit;
  (*pEVar1->_vptr_EmitXml[0xf])(pEVar1,(ulong)uVar2);
  if (((this->super_PrintLanguage).mods & 0x200) == 0) {
    pEVar1 = (this->super_PrintLanguage).emit;
    (*pEVar1->_vptr_EmitXml[0x19])(pEVar1,";",8);
    return;
  }
  return;
}

Assistant:

void PrintC::emitStatement(const PcodeOp *inst)

{
  int4 id = emit->beginStatement(inst);
  emitExpression(inst);
  emit->endStatement(id);
  if (!isSet(comma_separate))
    emit->print(";");
}